

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

bool __thiscall ON_Brep::IsValidVertex(ON_Brep *this,int vertex_index,ON_TextLog *text_log)

{
  ulong uVar1;
  uint *puVar2;
  uint uVar3;
  ON_BrepVertex *pOVar4;
  int *piVar5;
  ON_BrepEdge *pOVar6;
  bool bVar7;
  byte bVar8;
  bool bVar9;
  ulong uVar10;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar11;
  
  uVar14 = (ulong)(uint)vertex_index;
  if ((vertex_index < 0) ||
     ((this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_count <=
      vertex_index)) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,
                        "brep vertex_index = %d (should be >=0 and <%d=brep.m_V.Count() ).\n",uVar14
                        ,(ulong)(uint)(this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                                      super_ON_ClassArray<ON_BrepVertex>.m_count);
    }
  }
  else {
    pOVar4 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_a;
    if (pOVar4[uVar14].m_vertex_index == vertex_index) {
      uVar10 = (ulong)pOVar4[uVar14].m_ei.m_count;
      if (0 < (long)uVar10) {
        uVar15 = 0;
        uVar11 = uVar10;
LAB_003f1539:
        piVar5 = pOVar4[uVar14].m_ei.m_a;
        uVar3 = piVar5[uVar15];
        lVar13 = (long)(int)uVar3;
        if ((-1 < lVar13) &&
           ((int)uVar3 <
            (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count))
        {
          pOVar6 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
                   m_a;
          if (uVar3 != pOVar6[lVar13].m_edge_index) {
            if (text_log == (ON_TextLog *)0x0) goto LAB_003f15e8;
            ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",uVar14);
            ON_TextLog::PushIndent(text_log);
            ON_TextLog::Print(text_log,"vertex.m_ei[%d] = %d is a deleted edge.\n",
                              uVar15 & 0xffffffff,(ulong)uVar3);
            goto LAB_003f15e0;
          }
          if (uVar15 != 0) {
            uVar12 = 1;
            uVar16 = 0;
            do {
              if (piVar5[uVar16] == uVar3) {
                if ((pOVar6[lVar13].m_vi[0] == vertex_index) &&
                   (pOVar6[lVar13].m_vi[1] == vertex_index)) goto LAB_003f168a;
                if (text_log == (ON_TextLog *)0x0) goto LAB_003f15e8;
                ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",uVar14);
                ON_TextLog::PushIndent(text_log);
                ON_TextLog::Print(text_log,
                                  "vertex.m_ei[%d] and vertex.m_ei[%d] = %d but brep.m_E[%d].m_vi[0] = %d"
                                  ,uVar16 & 0xffffffff,uVar15 & 0xffffffff,(ulong)uVar3,(ulong)uVar3
                                  ,(ulong)(uint)pOVar6[lVar13].m_vi[0]);
                ON_TextLog::Print(text_log,
                                  "and ON_Brep.m_E[%d].m_vi[1] = %d (both m_vi[] values should be %d).\n"
                                  ,(ulong)uVar3,(ulong)(uint)pOVar6[lVar13].m_vi[1],uVar14);
                goto LAB_003f15e0;
              }
              uVar16 = uVar16 + 1;
              uVar12 = uVar12 + 1;
            } while (uVar15 != uVar16);
          }
LAB_003f1596:
          bVar9 = true;
          if ((pOVar6[lVar13].m_vi[0] != vertex_index) && (pOVar6[lVar13].m_vi[1] != vertex_index))
          {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",uVar14);
              ON_TextLog::PushIndent(text_log);
              ON_TextLog::Print(text_log,
                                "vertex.m_ei[%d] = %d but ON_Brep.m_E[%d].m_vi[] = [%d,%d]. At least one edge m_vi[] value should be %d.\n"
                                ,uVar15 & 0xffffffff,(ulong)uVar3,(ulong)uVar3,
                                (ulong)(uint)pOVar6[lVar13].m_vi[0],
                                (ulong)(uint)pOVar6[lVar13].m_vi[1],uVar14);
              goto LAB_003f15e0;
            }
            goto LAB_003f15e8;
          }
          goto LAB_003f15fd;
        }
        if (text_log == (ON_TextLog *)0x0) goto LAB_003f187f;
        ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",uVar14);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,"vertex.m_ei[%d] = %d (should be >=0 and <%d).\n",
                          uVar15 & 0xffffffff,(ulong)uVar3,
                          (ulong)(uint)(this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                                       super_ON_ClassArray<ON_BrepEdge>.m_count);
        goto LAB_003f1877;
      }
LAB_003f17db:
      bVar8 = 1;
      if (0.0 < pOVar4[uVar14].m_tolerance || pOVar4[uVar14].m_tolerance == 0.0) {
LAB_003f1828:
        return (bool)(bVar8 & 1);
      }
      if (text_log == (ON_TextLog *)0x0) goto LAB_003f187f;
      ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",uVar14);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"vertex.m_tolerace = %g (should be >= 0.0)\n",
                        pOVar4[uVar14].m_tolerance);
    }
    else {
      if (text_log == (ON_TextLog *)0x0) goto LAB_003f187f;
      ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",uVar14);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"vertex.m_vertex_index = %d (should be %d).\n",
                        (ulong)(uint)pOVar4[uVar14].m_vertex_index,uVar14);
    }
LAB_003f1877:
    ON_TextLog::PopIndent(text_log);
  }
LAB_003f187f:
  bVar9 = ON_IsNotValid();
  return bVar9;
  while (uVar1 = uVar12 + 1, puVar2 = (uint *)(piVar5 + uVar12), uVar12 = uVar1, *puVar2 != uVar3) {
LAB_003f168a:
    if (uVar15 <= uVar12) goto LAB_003f1596;
  }
  if (text_log != (ON_TextLog *)0x0) {
    ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",uVar14);
    ON_TextLog::PushIndent(text_log);
    ON_TextLog::Print(text_log,"vertex.m_ei[%d,%d,%d] = %d. An open edge index should appear once\n"
                      ,uVar16 & 0xffffffff,uVar15 & 0xffffffff,(ulong)((int)uVar1 - 1),(ulong)uVar3)
    ;
    ON_TextLog::Print(text_log,"in vertex.m_ei[] and a closed edge index should appear twice.\n");
LAB_003f15e0:
    ON_TextLog::PopIndent(text_log);
  }
LAB_003f15e8:
  bVar9 = false;
  bVar7 = ON_IsNotValid();
  uVar11 = (ulong)bVar7;
LAB_003f15fd:
  bVar8 = (byte)uVar11;
  if (!bVar9) goto LAB_003f1828;
  uVar15 = uVar15 + 1;
  if (uVar15 == uVar10) goto LAB_003f17db;
  goto LAB_003f1539;
}

Assistant:

bool
ON_Brep::IsValidVertex( int vertex_index, ON_TextLog* text_log ) const
{
  if ( vertex_index < 0 || vertex_index >= m_V.Count() )
  {
    if ( text_log )
      text_log->Print("brep vertex_index = %d (should be >=0 and <%d=brep.m_V.Count() ).\n",
                      vertex_index, m_V.Count());
    return ON_BrepIsNotValid();
  }
  const ON_BrepVertex& vertex = m_V[vertex_index];
  if ( vertex.m_vertex_index != vertex_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
      text_log->PushIndent();
      text_log->Print("vertex.m_vertex_index = %d (should be %d).\n",
                       vertex.m_vertex_index, vertex_index );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  const int vertex_edge_count = vertex.m_ei.Count();
  int i, j, vei, ei;
  for ( vei = 0; vei < vertex_edge_count; vei++ ) {
    ei = vertex.m_ei[vei];
    if ( ei < 0 || ei >= m_E.Count() )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
        text_log->PushIndent();
        text_log->Print("vertex.m_ei[%d] = %d (should be >=0 and <%d).\n", vei, ei, m_E.Count());
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    const ON_BrepEdge& edge = m_E[ei];
    if ( ei != edge.m_edge_index )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
        text_log->PushIndent();
        text_log->Print("vertex.m_ei[%d] = %d is a deleted edge.\n", vei, ei);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    for ( i = 0; i < vei; i++ ) 
    {
      if ( vertex.m_ei[i] == ei ) 
      {
        // edge should be closed
        if ( edge.m_vi[0] != vertex_index || edge.m_vi[1] != vertex_index )
        {
          if ( text_log )
          {
            text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
            text_log->PushIndent();
            text_log->Print("vertex.m_ei[%d] and vertex.m_ei[%d] = %d but brep.m_E[%d].m_vi[0] = %d",
                             i,vei,ei,ei,edge.m_vi[0]);
            text_log->Print("and ON_Brep.m_E[%d].m_vi[1] = %d (both m_vi[] values should be %d).\n",
                            ei,edge.m_vi[1],vertex_index);
            text_log->PopIndent();
          }
          return ON_BrepIsNotValid();
        }
        for (j = i+1; j < vei; j++ ) 
        {
          if ( vertex.m_ei[j] == ei )
          {
            if ( text_log )
            {
              text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
              text_log->PushIndent();
              text_log->Print("vertex.m_ei[%d,%d,%d] = %d. An open edge index should appear once\n",i,vei,j,ei);
              text_log->Print("in vertex.m_ei[] and a closed edge index should appear twice.\n");
              text_log->PopIndent();
            }
            return ON_BrepIsNotValid();
          }
        }
        break;
      }
    }
    if ( edge.m_vi[0] != vertex_index && edge.m_vi[1] != vertex_index )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
        text_log->PushIndent();
        text_log->Print("vertex.m_ei[%d] = %d but ON_Brep.m_E[%d].m_vi[] = [%d,%d]. "
                        "At least one edge m_vi[] value should be %d.\n",
                        vei,ei,ei,edge.m_vi[0],edge.m_vi[1],vertex_index);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
  }

  if ( vertex.m_tolerance < 0.0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
      text_log->PushIndent();
      text_log->Print("vertex.m_tolerace = %g (should be >= 0.0)\n",vertex.m_tolerance);
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  return true;
}